

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterValidator.cpp
# Opt level: O3

Result * CoreML::validateInt64Parameter
                   (Result *__return_storage_ptr__,string *parameterName,
                   Int64Parameter *int64Parameter,bool shouldBePositive)

{
  long lVar1;
  long lVar2;
  char cVar3;
  long lVar4;
  uint uVar5;
  ulong *puVar6;
  long *plVar7;
  bool bVar8;
  ulong uVar9;
  long *plVar10;
  size_type *psVar11;
  ulong uVar12;
  ulong *puVar13;
  ulong uVar14;
  uint uVar15;
  string err;
  string local_d0;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  bVar8 = !shouldBePositive;
  uVar14 = int64Parameter->defaultvalue_;
  lVar4 = (long)uVar14 >> 0x3f;
  cVar3 = (char)((long)uVar14 >> 0x3f);
  if (0 < (long)uVar14 || bVar8) {
    if (int64Parameter->_oneof_case_[0] == 10) {
      lVar1 = ((int64Parameter->AllowedValues_).range_)->minvalue_;
      if (0 < lVar1 || bVar8) {
        lVar2 = ((int64Parameter->AllowedValues_).range_)->maxvalue_;
        if (0 < lVar2 || bVar8) {
          if (lVar1 <= (long)uVar14 && (long)uVar14 <= lVar2) goto LAB_004f877b;
          uVar9 = -uVar14;
          if (0 < (long)uVar14) {
            uVar9 = uVar14;
          }
          uVar15 = 1;
          if (9 < uVar9) {
            uVar14 = uVar9;
            uVar5 = 4;
            do {
              uVar15 = uVar5;
              if (uVar14 < 100) {
                uVar15 = uVar15 - 2;
                goto LAB_004f90cd;
              }
              if (uVar14 < 1000) {
                uVar15 = uVar15 - 1;
                goto LAB_004f90cd;
              }
              if (uVar14 < 10000) goto LAB_004f90cd;
              bVar8 = 99999 < uVar14;
              uVar14 = uVar14 / 10000;
              uVar5 = uVar15 + 4;
            } while (bVar8);
            uVar15 = uVar15 + 1;
          }
LAB_004f90cd:
          local_b0[0] = local_a0;
          std::__cxx11::string::_M_construct((ulong)local_b0,(char)uVar15 - cVar3);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)((long)local_b0[0] - lVar4),uVar15,uVar9);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)local_b0,0,(char *)0x0,0x60ed00);
          plVar10 = plVar7 + 2;
          if ((long *)*plVar7 == plVar10) {
            local_80 = *plVar10;
            lStack_78 = plVar7[3];
            local_90 = &local_80;
          }
          else {
            local_80 = *plVar10;
            local_90 = (long *)*plVar7;
          }
          local_88 = plVar7[1];
          *plVar7 = (long)plVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
          plVar10 = plVar7 + 2;
          if ((long *)*plVar7 == plVar10) {
            local_60 = *plVar10;
            lStack_58 = plVar7[3];
            local_70 = &local_60;
          }
          else {
            local_60 = *plVar10;
            local_70 = (long *)*plVar7;
          }
          local_68 = plVar7[1];
          *plVar7 = (long)plVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_70,(ulong)(parameterName->_M_dataplus)._M_p);
          plVar10 = plVar7 + 2;
          if ((long *)*plVar7 == plVar10) {
            local_40 = *plVar10;
            lStack_38 = plVar7[3];
            local_50 = &local_40;
          }
          else {
            local_40 = *plVar10;
            local_50 = (long *)*plVar7;
          }
          local_48 = plVar7[1];
          *plVar7 = (long)plVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          psVar11 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_d0.field_2._M_allocated_capacity = *psVar11;
            local_d0.field_2._8_8_ = plVar7[3];
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar11;
            local_d0._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_d0._M_string_length = plVar7[1];
          *plVar7 = (long)psVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          if (local_50 != &local_40) {
            operator_delete(local_50,local_40 + 1);
          }
          if (local_70 != &local_60) {
            operator_delete(local_70,local_60 + 1);
          }
          if (local_90 != &local_80) {
            operator_delete(local_90,local_80 + 1);
          }
          if (local_b0[0] != local_a0) {
            operator_delete(local_b0[0],local_a0[0] + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_d0);
        }
        else {
          uVar14 = -lVar2;
          uVar15 = 1;
          if (9 < uVar14) {
            uVar9 = uVar14;
            uVar5 = 4;
            do {
              uVar15 = uVar5;
              if (uVar9 < 100) {
                uVar15 = uVar15 - 2;
                goto LAB_004f8c6f;
              }
              if (uVar9 < 1000) {
                uVar15 = uVar15 - 1;
                goto LAB_004f8c6f;
              }
              if (uVar9 < 10000) goto LAB_004f8c6f;
              bVar8 = 99999 < uVar9;
              uVar9 = uVar9 / 10000;
              uVar5 = uVar15 + 4;
            } while (bVar8);
            uVar15 = uVar15 + 1;
          }
LAB_004f8c6f:
          local_b0[0] = local_a0;
          std::__cxx11::string::_M_construct((ulong)local_b0,(char)uVar15 - (char)(lVar2 >> 0x3f));
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)((long)local_b0[0] - (lVar2 >> 0x3f)),uVar15,uVar14);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)local_b0,0,(char *)0x0,0x60ed7a);
          plVar10 = plVar7 + 2;
          if ((long *)*plVar7 == plVar10) {
            local_80 = *plVar10;
            lStack_78 = plVar7[3];
            local_90 = &local_80;
          }
          else {
            local_80 = *plVar10;
            local_90 = (long *)*plVar7;
          }
          local_88 = plVar7[1];
          *plVar7 = (long)plVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
          plVar10 = plVar7 + 2;
          if ((long *)*plVar7 == plVar10) {
            local_60 = *plVar10;
            lStack_58 = plVar7[3];
            local_70 = &local_60;
          }
          else {
            local_60 = *plVar10;
            local_70 = (long *)*plVar7;
          }
          local_68 = plVar7[1];
          *plVar7 = (long)plVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_70,(ulong)(parameterName->_M_dataplus)._M_p);
          plVar10 = plVar7 + 2;
          if ((long *)*plVar7 == plVar10) {
            local_40 = *plVar10;
            lStack_38 = plVar7[3];
            local_50 = &local_40;
          }
          else {
            local_40 = *plVar10;
            local_50 = (long *)*plVar7;
          }
          local_48 = plVar7[1];
          *plVar7 = (long)plVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          psVar11 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_d0.field_2._M_allocated_capacity = *psVar11;
            local_d0.field_2._8_8_ = plVar7[3];
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar11;
            local_d0._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_d0._M_string_length = plVar7[1];
          *plVar7 = (long)psVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          if (local_50 != &local_40) {
            operator_delete(local_50,local_40 + 1);
          }
          if (local_70 != &local_60) {
            operator_delete(local_70,local_60 + 1);
          }
          if (local_90 != &local_80) {
            operator_delete(local_90,local_80 + 1);
          }
          if (local_b0[0] != local_a0) {
            operator_delete(local_b0[0],local_a0[0] + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_d0);
        }
      }
      else {
        uVar14 = -lVar1;
        uVar15 = 1;
        if (9 < uVar14) {
          uVar9 = uVar14;
          uVar5 = 4;
          do {
            uVar15 = uVar5;
            if (uVar9 < 100) {
              uVar15 = uVar15 - 2;
              goto LAB_004f8a40;
            }
            if (uVar9 < 1000) {
              uVar15 = uVar15 - 1;
              goto LAB_004f8a40;
            }
            if (uVar9 < 10000) goto LAB_004f8a40;
            bVar8 = 99999 < uVar9;
            uVar9 = uVar9 / 10000;
            uVar5 = uVar15 + 4;
          } while (bVar8);
          uVar15 = uVar15 + 1;
        }
LAB_004f8a40:
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct((ulong)local_b0,(char)uVar15 - (char)(lVar1 >> 0x3f));
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)((long)local_b0[0] - (lVar1 >> 0x3f)),uVar15,uVar14);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)local_b0,0,(char *)0x0,0x60ed42);
        plVar10 = plVar7 + 2;
        if ((long *)*plVar7 == plVar10) {
          local_80 = *plVar10;
          lStack_78 = plVar7[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar10;
          local_90 = (long *)*plVar7;
        }
        local_88 = plVar7[1];
        *plVar7 = (long)plVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
        plVar10 = plVar7 + 2;
        if ((long *)*plVar7 == plVar10) {
          local_60 = *plVar10;
          lStack_58 = plVar7[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar10;
          local_70 = (long *)*plVar7;
        }
        local_68 = plVar7[1];
        *plVar7 = (long)plVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_70,(ulong)(parameterName->_M_dataplus)._M_p);
        plVar10 = plVar7 + 2;
        if ((long *)*plVar7 == plVar10) {
          local_40 = *plVar10;
          lStack_38 = plVar7[3];
          local_50 = &local_40;
        }
        else {
          local_40 = *plVar10;
          local_50 = (long *)*plVar7;
        }
        local_48 = plVar7[1];
        *plVar7 = (long)plVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        psVar11 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_d0.field_2._M_allocated_capacity = *psVar11;
          local_d0.field_2._8_8_ = plVar7[3];
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar11;
          local_d0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_d0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_50 != &local_40) {
          operator_delete(local_50,local_40 + 1);
        }
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0],local_a0[0] + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_d0);
      }
    }
    else {
      if (int64Parameter->_oneof_case_[0] != 0xb) {
LAB_004f877b:
        Result::Result(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      lVar1 = ((int64Parameter->AllowedValues_).range_)->maxvalue_;
      puVar6 = (ulong *)(lVar1 + 8);
      if (lVar1 == 0) {
        puVar6 = (ulong *)0x0;
      }
      puVar13 = (ulong *)(lVar1 + 8 +
                         (long)(int)((int64Parameter->AllowedValues_).range_)->minvalue_ * 8);
      if (lVar1 == 0) {
        puVar13 = (ulong *)0x0;
      }
      for (; puVar6 != puVar13; puVar6 = puVar6 + 1) {
        uVar9 = *puVar6;
        if (uVar9 == uVar14) goto LAB_004f877b;
        if ((long)uVar9 < 1 && !bVar8) {
          uVar14 = -uVar9;
          uVar15 = 1;
          if (uVar14 < 10) goto LAB_004f8e9e;
          uVar12 = uVar14;
          uVar5 = 4;
          goto LAB_004f87c1;
        }
      }
      uVar9 = -uVar14;
      if (0 < (long)uVar14) {
        uVar9 = uVar14;
      }
      uVar15 = 1;
      if (9 < uVar9) {
        uVar14 = uVar9;
        uVar5 = 4;
        do {
          uVar15 = uVar5;
          if (uVar14 < 100) {
            uVar15 = uVar15 - 2;
            goto LAB_004f8811;
          }
          if (uVar14 < 1000) {
            uVar15 = uVar15 - 1;
            goto LAB_004f8811;
          }
          if (uVar14 < 10000) goto LAB_004f8811;
          bVar8 = 99999 < uVar14;
          uVar14 = uVar14 / 10000;
          uVar5 = uVar15 + 4;
        } while (bVar8);
        uVar15 = uVar15 + 1;
      }
LAB_004f8811:
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct((ulong)local_b0,(char)uVar15 - cVar3);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)((long)local_b0[0] - lVar4),uVar15,uVar9);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)local_b0,0,(char *)0x0,0x60ed00);
      plVar10 = plVar7 + 2;
      if ((long *)*plVar7 == plVar10) {
        local_80 = *plVar10;
        lStack_78 = plVar7[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar10;
        local_90 = (long *)*plVar7;
      }
      local_88 = plVar7[1];
      *plVar7 = (long)plVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
      plVar10 = plVar7 + 2;
      if ((long *)*plVar7 == plVar10) {
        local_60 = *plVar10;
        lStack_58 = plVar7[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar10;
        local_70 = (long *)*plVar7;
      }
      local_68 = plVar7[1];
      *plVar7 = (long)plVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_70,(ulong)(parameterName->_M_dataplus)._M_p);
      plVar10 = plVar7 + 2;
      if ((long *)*plVar7 == plVar10) {
        local_40 = *plVar10;
        lStack_38 = plVar7[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar10;
        local_50 = (long *)*plVar7;
      }
      local_48 = plVar7[1];
      *plVar7 = (long)plVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      psVar11 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_d0.field_2._M_allocated_capacity = *psVar11;
        local_d0.field_2._8_8_ = plVar7[3];
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar11;
        local_d0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_d0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40 + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_d0);
    }
  }
  else {
    uVar14 = -uVar14;
    uVar15 = 1;
    if (9 < uVar14) {
      uVar9 = uVar14;
      uVar5 = 4;
      do {
        uVar15 = uVar5;
        if (uVar9 < 100) {
          uVar15 = uVar15 - 2;
          goto LAB_004f84b6;
        }
        if (uVar9 < 1000) {
          uVar15 = uVar15 - 1;
          goto LAB_004f84b6;
        }
        if (uVar9 < 10000) goto LAB_004f84b6;
        bVar8 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        uVar5 = uVar15 + 4;
      } while (bVar8);
      uVar15 = uVar15 + 1;
    }
LAB_004f84b6:
    local_b0[0] = local_a0;
    std::__cxx11::string::_M_construct((ulong)local_b0,(char)uVar15 - cVar3);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)((long)local_b0[0] - lVar4),uVar15,uVar14);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)local_b0,0,(char *)0x0,0x60ed0a);
    plVar10 = plVar7 + 2;
    if ((long *)*plVar7 == plVar10) {
      local_80 = *plVar10;
      lStack_78 = plVar7[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar10;
      local_90 = (long *)*plVar7;
    }
    local_88 = plVar7[1];
    *plVar7 = (long)plVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
    plVar10 = plVar7 + 2;
    if ((long *)*plVar7 == plVar10) {
      local_60 = *plVar10;
      lStack_58 = plVar7[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar10;
      local_70 = (long *)*plVar7;
    }
    local_68 = plVar7[1];
    *plVar7 = (long)plVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_70,(ulong)(parameterName->_M_dataplus)._M_p);
    plVar10 = plVar7 + 2;
    if ((long *)*plVar7 == plVar10) {
      local_40 = *plVar10;
      lStack_38 = plVar7[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar10;
      local_50 = (long *)*plVar7;
    }
    local_48 = plVar7[1];
    *plVar7 = (long)plVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    psVar11 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_d0.field_2._M_allocated_capacity = *psVar11;
      local_d0.field_2._8_8_ = plVar7[3];
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar11;
      local_d0._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_d0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0],local_a0[0] + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_d0);
  }
  goto LAB_004f86d7;
  while( true ) {
    if (uVar12 < 10000) goto LAB_004f8e9e;
    bVar8 = uVar12 < 100000;
    uVar12 = uVar12 / 10000;
    uVar5 = uVar15 + 4;
    if (bVar8) break;
LAB_004f87c1:
    uVar15 = uVar5;
    if (uVar12 < 100) {
      uVar15 = uVar15 - 2;
      goto LAB_004f8e9e;
    }
    if (uVar12 < 1000) {
      uVar15 = uVar15 - 1;
      goto LAB_004f8e9e;
    }
  }
  uVar15 = uVar15 + 1;
LAB_004f8e9e:
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct((ulong)local_b0,(char)uVar15 - (char)((long)uVar9 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)((long)local_b0[0] - ((long)uVar9 >> 0x3f)),uVar15,uVar14);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)local_b0,0,(char *)0x0,0x60ecbb);
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_80 = *plVar10;
    lStack_78 = plVar7[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar10;
    local_90 = (long *)*plVar7;
  }
  local_88 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_60 = *plVar10;
    lStack_58 = plVar7[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar10;
    local_70 = (long *)*plVar7;
  }
  local_68 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_70,(ulong)(parameterName->_M_dataplus)._M_p);
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_40 = *plVar10;
    lStack_38 = plVar7[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar10;
    local_50 = (long *)*plVar7;
  }
  local_48 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_d0.field_2._M_allocated_capacity = *psVar11;
    local_d0.field_2._8_8_ = plVar7[3];
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar11;
    local_d0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_d0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_d0);
LAB_004f86d7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result CoreML::validateInt64Parameter(const std::string& parameterName, const Specification::Int64Parameter& int64Parameter, bool shouldBePositive) {

    const ::google::protobuf::int64 defaultValue = int64Parameter.defaultvalue();

    if (shouldBePositive) {
        if (defaultValue <= 0) {
            std::string err = "Default Value (" + std::to_string(defaultValue) + ") for '" + parameterName + "' expected to be a positive value.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
    }

    if (int64Parameter.has_set()) {
        bool valueFoundInSet = false;
        for (const auto &value : int64Parameter.set().values()) {
            if (value == defaultValue) {
                valueFoundInSet = true;
                break;
            }
            if (value <= 0 && shouldBePositive) {
                std::string err = "Non-positive value (" + std::to_string(value) + ") in Allowed Values Set for '" + parameterName + "' is not allowed.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
        }
        if (false == valueFoundInSet) {
            std::string err = "Specified Default Value (" + std::to_string(defaultValue) + ") not found in Allowed Values Set for '" + parameterName + "'";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
    }
    else if (int64Parameter.has_range()) {
        const Specification::Int64Range& range = int64Parameter.range();

        if (range.minvalue() <= 0 && shouldBePositive) {
            std::string err = "Non-positive min value (" + std::to_string(range.minvalue()) + ") in Allowed Value Range for '" + parameterName + "' is not allowed.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }

        if (range.maxvalue() <= 0 && shouldBePositive) {
            std::string err = "Non-positive max value (" + std::to_string(range.maxvalue()) + ") in Allowed Value Range for '" + parameterName + "' is not allowed.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }

        if (defaultValue < range.minvalue() || defaultValue > range.maxvalue()) {
            std::string err = "Specified Default Value (" + std::to_string(defaultValue) + ") out of Allowed Value Range for '" + parameterName + "'";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }

        if (range.minvalue() > range.maxvalue()) {
            std::string err = "Specified minimum value (" + std::to_string(defaultValue) + ") greater than maximum value for '" + parameterName + "'";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);

        }
    }

    return Result();
}